

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::TransformPoint1d(int transid,FADREAL *in,FADREAL *out)

{
  FadExpr<FadUnaryMin<Fad<double>_>_> local_8;
  
  if (transid != 0) {
    local_8.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)(FadUnaryMin<Fad<double>_>)in;
    Fad<double>::operator=(out,&local_8);
    return;
  }
  Fad<double>::operator=(out,in);
  return;
}

Assistant:

void TPZShapeLinear::TransformPoint1d(int transid,FADREAL & in,FADREAL &out) {
		if (!transid) out =  in;
		else          out = -in;
	}